

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<float,long>
          (char *expected_expression,char *actual_expression,float *expected,long *actual)

{
  float *in_RCX;
  String *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  internal *in_RDI;
  long *in_R8;
  AssertionResult AVar2;
  float *in_stack_ffffffffffffffc0;
  float *in_stack_ffffffffffffffc8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if ((*in_RCX != (float)*in_R8) || (NAN(*in_RCX) || NAN((float)*in_R8))) {
    FormatForComparisonFailureMessage<float,long>
              (in_stack_ffffffffffffffc8,(long *)in_stack_ffffffffffffffc0);
    FormatForComparisonFailureMessage<long,float>
              ((long *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    EqFailure(in_RDI,in_RSI,(char *)in_RDX,(String *)&stack0xffffffffffffffc8,
              (String *)&stack0xffffffffffffffb8,false);
    String::~String(in_RDX);
    String::~String(in_RDX);
    sVar1.ptr_ = extraout_RDX;
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}